

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> __thiscall
punky::par::Parser::parse_block_statement(Parser *this)

{
  bool bVar1;
  pointer this_00;
  Parser *in_RSI;
  unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> local_78;
  undefined1 local_70 [8];
  unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> stmt;
  undefined4 local_60;
  __single_object blk;
  Token blk_tok;
  Parser *this_local;
  
  punky::tok::Token::Token((Token *)&blk,&in_RSI->m_curr_tok);
  std::make_unique<punky::ast::BlockStmt,punky::tok::Token&>((Token *)&stack0xffffffffffffffb0);
  consume(in_RSI);
  do {
    local_60 = RightBrace;
    bVar1 = curr_type_is(in_RSI,&stack0xffffffffffffffa0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
      unique_ptr((unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *)
                 this,(unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                       *)&stack0xffffffffffffffb0);
LAB_00118f65:
      stmt._M_t.
      super___uniq_ptr_impl<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>._M_t.
      super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>.
      super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl._0_4_ = 1;
      std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
      ~unique_ptr((unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *)
                  &stack0xffffffffffffffb0);
      punky::tok::Token::~Token((Token *)&blk);
      return (__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
              )(__uniq_ptr_data<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>,_true,_true>
                )this;
    }
    stmt._M_t.
    super___uniq_ptr_impl<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>._M_t.
    super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>.
    super__Head_base<0UL,_punky::ast::StmtNode_*,_false>._M_head_impl._4_4_ = 0x21;
    bVar1 = curr_type_is(in_RSI,(TokenType *)
                                ((long)&stmt._M_t.
                                        super___uniq_ptr_impl<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_punky::ast::StmtNode_*,_std::default_delete<punky::ast::StmtNode>_>
                                        .super__Head_base<0UL,_punky::ast::StmtNode_*,_false>.
                                        _M_head_impl + 4));
    if (bVar1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[36]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &in_RSI->m_errors,(char (*) [36])"Block statement missing closing \'}\'");
      std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>::
      unique_ptr<std::default_delete<punky::ast::BlockStmt>,void>
                ((unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>> *)
                 this,(nullptr_t)0x0);
      goto LAB_00118f65;
    }
    parse_statement((Parser *)local_70);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_70);
    if (bVar1) {
      this_00 = std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                ::operator->((unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                              *)&stack0xffffffffffffffb0);
      std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>::unique_ptr
                (&local_78,
                 (unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *)
                 local_70);
      ast::BlockStmt::push_stmt(this_00,&local_78);
      std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>::~unique_ptr
                (&local_78);
    }
    consume(in_RSI);
    std::unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_>::~unique_ptr
              ((unique_ptr<punky::ast::StmtNode,_std::default_delete<punky::ast::StmtNode>_> *)
               local_70);
  } while( true );
}

Assistant:

auto Parser::parse_block_statement() -> std::unique_ptr<ast::BlockStmt>
{
    auto blk_tok = m_curr_tok;
    auto blk     = std::make_unique<ast::BlockStmt>(blk_tok);
    consume();
    while (!curr_type_is(TokenType::RightBrace))
    {
        if (curr_type_is(TokenType::EOS))
        {
            m_errors.emplace_back("Block statement missing closing '}'");
            return nullptr;
        }
        auto stmt = parse_statement();
        if (stmt)
            blk->push_stmt(std::move(stmt));
        consume();
    }
    return blk;
}